

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShmSystemV.cpp
# Opt level: O0

void __thiscall
adios2::transport::ShmSystemV::ShmSystemV
          (ShmSystemV *this,uint projectID,size_t size,Comm *comm,bool removeAtClose)

{
  undefined8 in_RDX;
  int in_ESI;
  string *in_RDI;
  byte in_R8B;
  Comm *in_stack_fffffffffffffeb8;
  string *library;
  Transport *this_00;
  allocator local_121;
  string local_120 [4];
  int in_stack_fffffffffffffee4;
  string *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  undefined1 local_81 [56];
  undefined1 local_49 [40];
  _Alloc_hider local_21;
  undefined8 local_18;
  undefined4 local_c;
  
  local_21 = (_Alloc_hider)(in_R8B & 1);
  this_00 = (Transport *)local_49;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_49 + 1),"Shm",(allocator *)this_00);
  library = (string *)local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_81 + 1),"SystemV",(allocator *)library);
  Transport::Transport(this_00,in_RDI,library,in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string((string *)(local_81 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  *(undefined ***)in_RDI = &PTR__ShmSystemV_01136920;
  std::__cxx11::string::string((string *)in_RDI[7].field_2._M_local_buf);
  *(undefined4 *)&in_RDI[8].field_2 = local_c;
  *(undefined4 *)((long)&in_RDI[8].field_2 + 4) = 0xffffffff;
  *(undefined8 *)((long)&in_RDI[8].field_2 + 8) = 0;
  *(undefined8 *)(in_RDI + 9) = local_18;
  *(byte *)&in_RDI[9]._M_string_length = (byte)local_21 & 1;
  if (local_c == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"Toolkit",&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"transport::shm::ShmSystemV",&local_d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"ShmSystemV",(allocator *)&stack0xffffffffffffff07);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_120,"projectID can\'t be zero, in shared memory segment",&local_121);
    helper::Throw<std::invalid_argument>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  return;
}

Assistant:

ShmSystemV::ShmSystemV(const unsigned int projectID, const size_t size, helper::Comm const &comm,
                       const bool removeAtClose)
: Transport("Shm", "SystemV", comm), m_ProjectID(projectID), m_Size(size),
  m_RemoveAtClose(removeAtClose)
{
    if (projectID == 0)
    {
        helper::Throw<std::invalid_argument>("Toolkit", "transport::shm::ShmSystemV", "ShmSystemV",
                                             "projectID can't be zero, in shared memory segment");
    }
}